

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O2

void dmrC_show_identifier_stats(dmr_C *C)

{
  ident **ppiVar1;
  uint uVar2;
  ulong uVar3;
  ident *piVar4;
  long lVar5;
  int aiStack_1b8 [2];
  int distribution [100];
  
  fprintf(_stderr,"identifiers: %d hits, %d misses\n",(ulong)(uint)C->T->ident_hit);
  for (lVar5 = 0; lVar5 != 100; lVar5 = lVar5 + 1) {
    aiStack_1b8[lVar5] = 0;
  }
  ppiVar1 = C->T->hash_table;
  for (lVar5 = 0; lVar5 != 0x2000; lVar5 = lVar5 + 1) {
    piVar4 = (ident *)(ppiVar1 + lVar5);
    uVar2 = 0xffffffff;
    do {
      piVar4 = piVar4->next;
      uVar2 = uVar2 + 1;
    } while (piVar4 != (ident *)0x0);
    uVar3 = (ulong)uVar2;
    if (0x62 < uVar2) {
      uVar3 = 99;
    }
    aiStack_1b8[uVar3] = aiStack_1b8[uVar3] + 1;
  }
  for (uVar3 = 0; uVar3 != 100; uVar3 = uVar3 + 1) {
    if (aiStack_1b8[uVar3] != 0) {
      fprintf(_stderr,"%2d: %d buckets\n",uVar3 & 0xffffffff);
    }
  }
  return;
}

Assistant:

void dmrC_show_identifier_stats(struct dmr_C *C)
{
	int i;
	int distribution[100];

	fprintf(stderr, "identifiers: %d hits, %d misses\n", 
		C->T->ident_hit, C->T->ident_miss);

	for (i = 0; i < 100; i++)
		distribution[i] = 0;

	for (i = 0; i < IDENT_HASH_SIZE; i++) {
		struct ident *ident = C->T->hash_table[i];
		int count = 0;

		while (ident) {
			count++;
			ident = ident->next;
		}
		if (count > 99)
			count = 99;
		distribution[count]++;
	}

	for (i = 0; i < 100; i++) {
		if (distribution[i])
			fprintf(stderr, "%2d: %d buckets\n", i,
				distribution[i]);
	}
}